

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

DomainEntry * __thiscall DomainEntry::CreateCopy(DomainEntry *this)

{
  char *pcVar1;
  DomainEntry *local_18;
  DomainEntry *key;
  DomainEntry *this_local;
  
  local_18 = (DomainEntry *)operator_new(0x20);
  DomainEntry(local_18);
  if ((local_18 != (DomainEntry *)0x0) &&
     (local_18->domain_length = this->domain_length, this->domain_length != 0)) {
    if ((local_18->domain != (char *)0x0) && (local_18->domain != (char *)0x0)) {
      operator_delete__(local_18->domain);
    }
    pcVar1 = (char *)operator_new__((ulong)this->domain_length + 1);
    local_18->domain = pcVar1;
    if (local_18->domain == (char *)0x0) {
      if (local_18 != (DomainEntry *)0x0) {
        ~DomainEntry(local_18);
        operator_delete(local_18);
      }
      local_18 = (DomainEntry *)0x0;
    }
    else {
      memcpy(local_18->domain,this->domain,(ulong)this->domain_length);
      local_18->domain[this->domain_length] = '\0';
    }
  }
  return local_18;
}

Assistant:

DomainEntry * DomainEntry::CreateCopy()
{
    DomainEntry * key = new DomainEntry();

    if (key != NULL)
    {
        key->domain_length = domain_length;
        if (domain_length > 0) {
            if (key->domain != NULL) {
                delete[] key->domain;
            }

            key->domain = new char[(size_t)domain_length+1];

            if (key->domain == NULL) {
                delete key;
                key = NULL;
            }
            else {
                memcpy(key->domain, domain, domain_length);
                key->domain[domain_length] = 0;
            }
        }
    }

    return key;
}